

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatLabel
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,uint32_t labelId)

{
  uint uVar1;
  Error EVar2;
  LabelEntry **ppLVar3;
  uint in_ECX;
  long in_RDX;
  String *in_RDI;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  LabelEntry *pe;
  uint32_t parentId;
  LabelEntry *le;
  size_t in_stack_fffffffffffffde0;
  String *in_stack_fffffffffffffde8;
  undefined1 *in_stack_fffffffffffffdf0;
  String *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  ZoneString<16UL> *pZVar4;
  ModifyOp op;
  LabelEntry *in_stack_fffffffffffffe08;
  LabelEntry *local_1e8;
  
  op = (ModifyOp)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  if ((in_RDX != 0) && (*(long *)(in_RDX + 0x30) != 0)) {
    if (in_ECX < *(uint *)(*(long *)(in_RDX + 0x30) + 0x100)) {
      ppLVar3 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::LabelEntry_*> *)in_stack_fffffffffffffde8,
                           in_stack_fffffffffffffde0);
      local_1e8 = *ppLVar3;
    }
    else {
      local_1e8 = (LabelEntry *)0x0;
    }
    if (local_1e8 == (LabelEntry *)0x0) {
      EVar2 = String::_opFormat(in_RDI,kAppend,"<InvalidLabel:%u>",(ulong)in_ECX);
      return EVar2;
    }
    if (*(int *)&local_1e8->_name != 0) {
      if (local_1e8->_parentId != 0xffffffff) {
        uVar1 = local_1e8->_parentId;
        if (uVar1 < *(uint *)(*(long *)(in_RDX + 0x30) + 0x100)) {
          ppLVar3 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                              ((ZoneVector<asmjit::v1_14::LabelEntry_*> *)in_stack_fffffffffffffde8,
                               in_stack_fffffffffffffde0);
          in_stack_fffffffffffffe08 = *ppLVar3;
        }
        else {
          in_stack_fffffffffffffe08 = (LabelEntry *)0x0;
        }
        if (in_stack_fffffffffffffe08 == (LabelEntry *)0x0) {
          EVar2 = String::_opFormat(in_RDI,kAppend,"<InvalidLabel:%u>",(ulong)in_ECX);
        }
        else if (*(int *)&in_stack_fffffffffffffe08->_name == 0) {
          EVar2 = String::_opFormat(in_RDI,kAppend,"L%u",(ulong)uVar1);
        }
        else {
          pZVar4 = &in_stack_fffffffffffffe08->_name;
          if (*(uint *)pZVar4 < 0xc) {
            in_stack_fffffffffffffdf0 = &in_stack_fffffffffffffe08->field_0x34;
          }
          else {
            in_stack_fffffffffffffdf0 = *(undefined1 **)&in_stack_fffffffffffffe08->field_0x38;
          }
          in_stack_fffffffffffffdf8 = in_RDI;
          EVar2 = String::_opString((String *)in_stack_fffffffffffffe08,
                                    (ModifyOp)((ulong)pZVar4 >> 0x20),(char *)in_RDI,
                                    (size_t)in_stack_fffffffffffffdf0);
          op = (ModifyOp)((ulong)pZVar4 >> 0x20);
        }
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = String::_opChar(in_stack_fffffffffffffde8,
                                (ModifyOp)(in_stack_fffffffffffffde0 >> 0x20),
                                (char)(in_stack_fffffffffffffde0 >> 0x18));
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      if ((local_1e8->_type == kAnonymous) &&
         (EVar2 = String::_opFormat(in_RDI,kAppend,"L%u@",(ulong)in_ECX), EVar2 != 0)) {
        return EVar2;
      }
      EVar2 = String::_opString((String *)in_stack_fffffffffffffe08,op,
                                (char *)in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0)
      ;
      return EVar2;
    }
  }
  EVar2 = String::_opFormat(in_RDI,kAppend,"L%u",(ulong)in_ECX);
  return EVar2;
}

Assistant:

Error formatLabel(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  uint32_t labelId) noexcept {

  DebugUtils::unused(formatFlags);

  if (emitter && emitter->code()) {
    const LabelEntry* le = emitter->code()->labelEntry(labelId);
    if (ASMJIT_UNLIKELY(!le))
      return sb.appendFormat("<InvalidLabel:%u>", labelId);

    if (le->hasName()) {
      if (le->hasParent()) {
        uint32_t parentId = le->parentId();
        const LabelEntry* pe = emitter->code()->labelEntry(parentId);

        if (ASMJIT_UNLIKELY(!pe))
          ASMJIT_PROPAGATE(sb.appendFormat("<InvalidLabel:%u>", labelId));
        else if (ASMJIT_UNLIKELY(!pe->hasName()))
          ASMJIT_PROPAGATE(sb.appendFormat("L%u", parentId));
        else
          ASMJIT_PROPAGATE(sb.append(pe->name()));

        ASMJIT_PROPAGATE(sb.append('.'));
      }

      if (le->type() == LabelType::kAnonymous)
        ASMJIT_PROPAGATE(sb.appendFormat("L%u@", labelId));
      return sb.append(le->name());
    }
  }

  return sb.appendFormat("L%u", labelId);
}